

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

Tas_Man_t * Tas_ManAlloc(Gia_Man_t *pAig,int nBTLimit)

{
  Tas_Man_t *pPars;
  Gia_Obj_t **ppGVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  int *piVar5;
  float *pfVar6;
  
  pPars = (Tas_Man_t *)calloc(1,0x120);
  Tas_SetDefaultParams((Tas_Par_t *)pPars);
  pPars->pAig = pAig;
  (pPars->Pars).nBTLimit = nBTLimit;
  (pPars->pClauses).nSize = 10000;
  (pPars->pJust).nSize = 10000;
  (pPars->pProp).nSize = 10000;
  ppGVar1 = (Gia_Obj_t **)malloc(80000);
  (pPars->pProp).pData = ppGVar1;
  ppGVar1 = (Gia_Obj_t **)malloc(80000);
  (pPars->pJust).pData = ppGVar1;
  ppGVar1 = (Gia_Obj_t **)malloc(80000);
  (pPars->pClauses).pData = ppGVar1;
  (pPars->pClauses).iHead = 1;
  (pPars->pClauses).iTail = 1;
  pVVar2 = Vec_IntAlloc(1000);
  pPars->vModel = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  pPars->vLevReas = pVVar2;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(8000);
  pVVar3->pArray = ppvVar4;
  pPars->vTemp = pVVar3;
  (pPars->pStore).iCur = 0x10;
  (pPars->pStore).nSize = 10000;
  piVar5 = (int *)malloc(40000);
  (pPars->pStore).pData = piVar5;
  piVar5 = (int *)calloc((long)pAig->nObjs * 2,4);
  pPars->pWatches = piVar5;
  pVVar2 = Vec_IntAlloc(100);
  pPars->vWatchLits = pVVar2;
  pfVar6 = (float *)calloc((long)pAig->nObjs,4);
  pPars->pActivity = pfVar6;
  pVVar2 = Vec_IntAlloc(100);
  pPars->vActiveVars = pVVar2;
  return pPars;
}

Assistant:

Tas_Man_t * Tas_ManAlloc( Gia_Man_t * pAig, int nBTLimit )
{
    Tas_Man_t * p;
    p = ABC_CALLOC( Tas_Man_t, 1 );
    Tas_SetDefaultParams( &p->Pars );
    p->pAig           = pAig;
    p->Pars.nBTLimit  = nBTLimit;
    p->pProp.nSize    = p->pJust.nSize = p->pClauses.nSize = 10000;
    p->pProp.pData    = ABC_ALLOC( Gia_Obj_t *, p->pProp.nSize );
    p->pJust.pData    = ABC_ALLOC( Gia_Obj_t *, p->pJust.nSize );
    p->pClauses.pData = ABC_ALLOC( Gia_Obj_t *, p->pClauses.nSize );
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->vModel         = Vec_IntAlloc( 1000 );
    p->vLevReas       = Vec_IntAlloc( 1000 );
    p->vTemp          = Vec_PtrAlloc( 1000 );
    p->pStore.iCur    = 16;
    p->pStore.nSize   = 10000;
    p->pStore.pData   = ABC_ALLOC( int, p->pStore.nSize );
    p->pWatches       = ABC_CALLOC( int, 2 * Gia_ManObjNum(pAig) );
    p->vWatchLits     = Vec_IntAlloc( 100 );
    p->pActivity      = ABC_CALLOC( float, Gia_ManObjNum(pAig) );
    p->vActiveVars    = Vec_IntAlloc( 100 );
    return p;
}